

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CGL::Application::resize(Application *this,size_t w,size_t h)

{
  size_t in_RDX;
  Application *in_RSI;
  long in_RDI;
  
  *(Application **)(in_RDI + 0x2b0) = in_RSI;
  *(size_t *)(in_RDI + 0x2b8) = in_RDX;
  CGL::Camera::set_screen_size(in_RDI + 0x30,(ulong)in_RSI);
  if ((*(byte *)(in_RDI + 0x412) & 1) != 0) {
    OSDText::resize((OSDText *)(in_RDI + 0x388),(size_t)in_RSI,in_RDX);
    set_projection_matrix(in_RSI);
  }
  if (*(int *)(in_RDI + 0x18) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x28) + 0x20))(*(long **)(in_RDI + 0x28),in_RSI,in_RDX);
  }
  return;
}

Assistant:

void Application::resize(size_t w, size_t h) {
  screenW = w;
  screenH = h;
  camera.set_screen_size(w, h);
  if (gl_window) {
    textManager.resize(w, h);
    set_projection_matrix();
  }

  if (mode != EDIT_MODE) {
    renderer->set_frame_size(w, h);
  }
}